

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O3

bool tcu::floatUlpThresholdCompare
               (TestLog *log,char *imageSetName,char *imageSetDesc,ConstPixelBufferAccess *reference
               ,ConstPixelBufferAccess *result,UVec4 *threshold,CompareLogMode logMode)

{
  int width;
  int height;
  uint depth;
  ChannelOrder CVar1;
  TextureFormat TVar2;
  TextureFormat TVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  deUint32 dVar7;
  TextureChannelClass TVar8;
  TestError *this;
  ulong uVar9;
  ConstPixelBufferAccess *pCVar10;
  ulong uVar11;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  int z;
  ChannelOrder __fd;
  _Alloc_hider _Var12;
  ulong uVar13;
  int y;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  uint uVar17;
  uint uVar19;
  uint uVar20;
  undefined1 auVar18 [16];
  uint uVar21;
  Vector<bool,_4> res;
  Vec4 cmpPix;
  Vec4 refPix;
  PixelBufferAccess errorMask;
  TextureLevel errorMaskStorage;
  allocator<char> local_4ca;
  allocator<char> local_4c9;
  ConstPixelBufferAccess *local_4c8;
  TextureFormat local_4c0;
  UVec4 *local_4b8;
  int local_4ac;
  Vec4 local_4a8;
  Vec4 local_498;
  string local_488;
  string local_468;
  char *local_448;
  char *local_440;
  Vector<unsigned_int,_4> local_438;
  string local_428;
  string local_408;
  ulong local_3e8;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  LogImageSet local_360;
  undefined1 local_320 [8];
  size_type local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  _Alloc_hider local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0 [6];
  undefined1 local_290 [8];
  float local_288;
  float local_284;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  _Alloc_hider local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260 [6];
  undefined1 local_200 [8];
  float local_1f8;
  float local_1f4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  _Alloc_hider local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0 [4];
  ios_base local_188 [264];
  ConstPixelBufferAccess local_80;
  TextureLevel local_58;
  
  width = (reference->m_size).m_data[0];
  height = (reference->m_size).m_data[1];
  depth = (reference->m_size).m_data[2];
  local_200._0_4_ = RGB;
  local_200._4_4_ = UNORM_INT8;
  local_4c8 = reference;
  local_4b8 = threshold;
  TextureLevel::TextureLevel(&local_58,(TextureFormat *)local_200,width,height,depth);
  TextureLevel::getAccess((PixelBufferAccess *)&local_80,&local_58);
  local_438.m_data[0] = 0;
  local_438.m_data[1] = 0;
  local_438.m_data[2] = 0;
  local_438.m_data[3] = 0;
  local_498.m_data[0] = 0.0;
  local_498.m_data[1] = 0.0;
  local_498.m_data[2] = 0.0;
  local_498.m_data[3] = 0.0;
  local_4a8.m_data[0] = 1.0;
  local_4a8.m_data[1] = 1.0;
  local_4a8.m_data[2] = 1.0;
  local_4a8.m_data[3] = 1.0;
  local_4c0 = (TextureFormat)log;
  local_448 = imageSetDesc;
  local_440 = imageSetName;
  if ((((result->m_size).m_data[0] != width) || ((result->m_size).m_data[1] != height)) ||
     ((result->m_size).m_data[2] != depth)) {
    this = (TestError *)__cxa_allocate_exception(0x38);
    TestError::TestError
              (this,(char *)0x0,
               "result.getWidth() == width && result.getHeight() == height && result.getDepth() == depth"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuImageCompare.cpp"
               ,499);
    __cxa_throw(this,&TestError::typeinfo,Exception::~Exception);
  }
  if (0 < (int)depth) {
    uVar13 = 0;
    do {
      if (0 < height) {
        z = 0;
        local_3e8 = uVar13;
        do {
          if (0 < width) {
            y = 0;
            local_4ac = z;
            do {
              ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)local_200,(int)local_4c8,y,z);
              ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_290,(int)result,y,z);
              dVar4 = computeFloatFlushRelaxedULPDiff((float)local_200._0_4_,(float)local_290._0_4_)
              ;
              dVar5 = computeFloatFlushRelaxedULPDiff((float)local_200._4_4_,(float)local_290._4_4_)
              ;
              dVar6 = computeFloatFlushRelaxedULPDiff(local_1f8,local_288);
              dVar7 = computeFloatFlushRelaxedULPDiff(local_1f4,local_284);
              uVar13 = local_3e8;
              z = local_4ac;
              auVar18._0_4_ =
                   -(uint)((int)(local_4b8->m_data[0] ^ 0x80000000) < (int)(dVar4 ^ 0x80000000));
              auVar18._4_4_ =
                   -(uint)((int)(local_4b8->m_data[1] ^ 0x80000000) < (int)(dVar5 ^ 0x80000000));
              auVar18._8_4_ =
                   -(uint)((int)(local_4b8->m_data[2] ^ 0x80000000) < (int)(dVar6 ^ 0x80000000));
              auVar18._12_4_ =
                   -(uint)((int)(local_4b8->m_data[3] ^ 0x80000000) < (int)(dVar7 ^ 0x80000000));
              auVar18 = packssdw(auVar18,auVar18);
              auVar18 = packsswb(auVar18 ^ _DAT_01bce6f0,auVar18 ^ _DAT_01bce6f0);
              if ((byte)(auVar18[0] & DAT_01b805f0) == 0) {
                bVar14 = false;
              }
              else {
                uVar11 = 0;
                do {
                  uVar9 = uVar11;
                  if (uVar9 == 3) break;
                  uVar11 = uVar9 + 1;
                } while (local_320[uVar9 + 1] != '\0');
                bVar14 = 2 < uVar9;
              }
              uVar17 = -(uint)((int)(dVar4 ^ 0x80000000) < (int)(local_438.m_data[0] ^ 0x80000000));
              uVar19 = -(uint)((int)(dVar5 ^ 0x80000000) < (int)(local_438.m_data[1] ^ 0x80000000));
              uVar20 = -(uint)((int)(dVar6 ^ 0x80000000) < (int)(local_438.m_data[2] ^ 0x80000000));
              uVar21 = -(uint)((int)(dVar7 ^ 0x80000000) < (int)(local_438.m_data[3] ^ 0x80000000));
              local_438.m_data[1] = ~uVar19 & dVar5 | local_438.m_data[1] & uVar19;
              local_438.m_data[0] = ~uVar17 & dVar4 | local_438.m_data[0] & uVar17;
              local_438.m_data[3] = ~uVar21 & dVar7 | local_438.m_data[3] & uVar21;
              local_438.m_data[2] = ~uVar20 & dVar6 | local_438.m_data[2] & uVar20;
              local_320._4_4_ = 0.0;
              if (bVar14) {
                local_320._0_4_ = 0.0;
                local_320._4_4_ = 1.0;
              }
              else {
                local_320._0_4_ = 1.0;
              }
              local_318 = 0x3f80000000000000;
              PixelBufferAccess::setPixel
                        ((PixelBufferAccess *)&local_80,(Vec4 *)local_320,y,local_4ac,(int)local_3e8
                        );
              y = y + 1;
            } while (y != width);
          }
          z = z + 1;
        } while (z != height);
      }
      uVar17 = (int)uVar13 + 1;
      uVar13 = (ulong)uVar17;
    } while (uVar17 != depth);
  }
  TVar2 = local_4c0;
  auVar16._0_4_ =
       -(uint)((int)(local_4b8->m_data[0] ^ 0x80000000) < (int)(local_438.m_data[0] ^ 0x80000000));
  auVar16._4_4_ =
       -(uint)((int)(local_4b8->m_data[1] ^ 0x80000000) < (int)(local_438.m_data[1] ^ 0x80000000));
  auVar16._8_4_ =
       -(uint)((int)(local_4b8->m_data[2] ^ 0x80000000) < (int)(local_438.m_data[2] ^ 0x80000000));
  auVar16._12_4_ =
       -(uint)((int)(local_4b8->m_data[3] ^ 0x80000000) < (int)(local_438.m_data[3] ^ 0x80000000));
  auVar18 = packssdw(auVar16,auVar16);
  auVar15._8_4_ = 0xffffffff;
  auVar15._0_8_ = 0xffffffffffffffff;
  auVar15._12_4_ = 0xffffffff;
  auVar18 = packsswb(auVar15 ^ auVar18,auVar15 ^ auVar18);
  CVar1 = auVar18._0_4_ & (ChannelOrder)DAT_01b805f0;
  local_200._4_4_ = local_200._4_4_;
  local_200._0_4_ = CVar1;
  __fd = local_4c0.order;
  if ((char)CVar1 == '\0') {
    bVar14 = false;
LAB_01994af1:
    TVar8 = getTextureChannelClass((local_4c8->m_format).type);
    if ((TVar8 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) ||
       (TVar8 = getTextureChannelClass((result->m_format).type),
       TVar8 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)) {
      anon_unknown_50::computeScaleAndBias(local_4c8,result,&local_4a8,&local_498);
      TVar3 = local_4c0;
      local_4c0.order = TVar2.order;
      local_4c0.type = TVar2.type;
      local_200._0_4_ = local_4c0.order;
      local_200._4_4_ = local_4c0.type;
      local_4c0 = TVar3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1f8,
                 "Result and reference images are normalized with formula p * ",0x3c);
      operator<<((ostream *)&local_1f8,&local_4a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8," + ",3);
      operator<<((ostream *)&local_1f8,&local_498);
      MessageBuilder::operator<<
                ((MessageBuilder *)local_200,(EndMessageToken *)&TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
      std::ios_base::~ios_base(local_188);
    }
    TVar3 = local_4c0;
    if (bVar14 == false) {
      local_4c0.order = TVar2.order;
      local_4c0.type = TVar2.type;
      local_200._0_4_ = local_4c0.order;
      local_200._4_4_ = local_4c0.type;
      local_4c0 = TVar3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1f8,"Image comparison failed: max difference = ",0x2a);
      operator<<((ostream *)&local_1f8,&local_438);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8,", threshold = ",0xe)
      ;
      operator<<((ostream *)&local_1f8,local_4b8);
      MessageBuilder::operator<<
                ((MessageBuilder *)local_200,(EndMessageToken *)&TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
      std::ios_base::~ios_base(local_188);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,local_440,&local_4c9);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,local_448,&local_4ca);
    LogImageSet::LogImageSet(&local_360,&local_468,&local_488);
    TestLog::startImageSet
              ((TestLog *)TVar2,local_360.m_name._M_dataplus._M_p,
               local_360.m_description._M_dataplus._M_p);
    local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"Result","");
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"Result","");
    LogImage::LogImage((LogImage *)local_200,&local_3c0,&local_3e0,result,&local_4a8,&local_498,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_200,__fd,__buf_00,(size_t)result);
    local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"Reference","");
    local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"Reference","");
    pCVar10 = local_4c8;
    LogImage::LogImage((LogImage *)local_290,&local_408,&local_428,local_4c8,&local_4a8,&local_498,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_290,__fd,__buf_01,(size_t)pCVar10);
    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"ErrorMask","");
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"Error mask","");
    pCVar10 = &local_80;
    LogImage::LogImage((LogImage *)local_320,&local_380,&local_3a0,pCVar10,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    TVar2 = local_4c0;
    LogImage::write((LogImage *)local_320,local_4c0.order,__buf_02,(size_t)pCVar10);
    TestLog::endImageSet((TestLog *)TVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_p != local_2f0) {
      operator_delete(local_300._M_p,local_2f0[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_320._4_4_,local_320._0_4_) != &local_310) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_320._4_4_,local_320._0_4_),
                      local_310._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_p != local_260) {
      operator_delete(local_270._M_p,local_260[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_290._4_4_,local_290._0_4_) != &local_280) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_290._4_4_,local_290._0_4_),
                      local_280._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != &local_428.field_2) {
      operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != &local_408.field_2) {
      operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_p != local_1d0) {
      operator_delete(local_1e0._M_p,local_1d0[0]._M_allocated_capacity + 1);
    }
    if (local_200 != (undefined1  [8])&local_1f0) {
      operator_delete((void *)local_200,local_1f0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360.m_description._M_dataplus._M_p != &local_360.m_description.field_2) {
      operator_delete(local_360.m_description._M_dataplus._M_p,
                      local_360.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360.m_name._M_dataplus._M_p != &local_360.m_name.field_2) {
      operator_delete(local_360.m_name._M_dataplus._M_p,
                      local_360.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_dataplus._M_p != &local_488.field_2) {
      operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
    }
    _Var12._M_p = local_468._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_dataplus._M_p == &local_468.field_2) goto LAB_01995062;
  }
  else {
    uVar13 = 0;
    do {
      uVar11 = uVar13;
      if (uVar11 == 3) break;
      uVar13 = uVar11 + 1;
    } while (local_200[uVar11 + 1] != '\0');
    bVar14 = 2 < uVar11;
    if (logMode == COMPARE_LOG_EVERYTHING || !bVar14) goto LAB_01994af1;
    if (logMode != COMPARE_LOG_RESULT) goto LAB_01995062;
    if (((result->m_format).order != RGBA) || ((result->m_format).type != UNORM_INT8)) {
      computePixelScaleBias(result,&local_4a8,&local_498);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_320,local_440,(allocator<char> *)&local_3c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_360,local_448,(allocator<char> *)&local_3e0);
    LogImageSet::LogImageSet((LogImageSet *)local_290,(string *)local_320,&local_360.m_name);
    TestLog::startImageSet
              ((TestLog *)TVar2,(char *)CONCAT44(local_290._4_4_,local_290._0_4_),local_270._M_p);
    local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"Result","");
    local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"Result","");
    LogImage::LogImage((LogImage *)local_200,&local_468,&local_488,result,&local_4a8,&local_498,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_200,__fd,__buf,(size_t)result);
    TestLog::endImageSet((TestLog *)TVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_p != local_1d0) {
      operator_delete(local_1e0._M_p,local_1d0[0]._M_allocated_capacity + 1);
    }
    if (local_200 != (undefined1  [8])&local_1f0) {
      operator_delete((void *)local_200,local_1f0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_dataplus._M_p != &local_488.field_2) {
      operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_dataplus._M_p != &local_468.field_2) {
      operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_p != local_260) {
      operator_delete(local_270._M_p,local_260[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_290._4_4_,local_290._0_4_) != &local_280) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_290._4_4_,local_290._0_4_),
                      local_280._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360.m_name._M_dataplus._M_p != &local_360.m_name.field_2) {
      operator_delete(local_360.m_name._M_dataplus._M_p,
                      local_360.m_name.field_2._M_allocated_capacity + 1);
    }
    _Var12._M_p = (pointer)CONCAT44(local_320._4_4_,local_320._0_4_);
    local_468.field_2._M_allocated_capacity = local_310._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var12._M_p == &local_310) goto LAB_01995062;
  }
  operator_delete(_Var12._M_p,local_468.field_2._M_allocated_capacity + 1);
LAB_01995062:
  TextureLevel::~TextureLevel(&local_58);
  return bVar14;
}

Assistant:

bool floatUlpThresholdCompare (TestLog& log, const char* imageSetName, const char* imageSetDesc, const ConstPixelBufferAccess& reference, const ConstPixelBufferAccess& result, const UVec4& threshold, CompareLogMode logMode)
{
	int					width				= reference.getWidth();
	int					height				= reference.getHeight();
	int					depth				= reference.getDepth();
	TextureLevel		errorMaskStorage	(TextureFormat(TextureFormat::RGB, TextureFormat::UNORM_INT8), width, height, depth);
	PixelBufferAccess	errorMask			= errorMaskStorage.getAccess();
	UVec4				maxDiff				(0, 0, 0, 0);
	Vec4				pixelBias			(0.0f, 0.0f, 0.0f, 0.0f);
	Vec4				pixelScale			(1.0f, 1.0f, 1.0f, 1.0f);

	TCU_CHECK(result.getWidth() == width && result.getHeight() == height && result.getDepth() == depth);

	for (int z = 0; z < depth; z++)
	{
		for (int y = 0; y < height; y++)
		{
			for (int x = 0; x < width; x++)
			{
				const Vec4	refPix	= reference.getPixel(x, y, z);
				const Vec4	cmpPix	= result.getPixel(x, y, z);
				const UVec4	diff	= computeFlushRelaxedULPDiff(refPix, cmpPix);
				const bool	isOk	= boolAll(lessThanEqual(diff, threshold));

				maxDiff = max(maxDiff, diff);

				errorMask.setPixel(isOk ? Vec4(0.0f, 1.0f, 0.0f, 1.0f) : Vec4(1.0f, 0.0f, 0.0f, 1.0f), x, y, z);
			}
		}
	}

	bool compareOk = boolAll(lessThanEqual(maxDiff, threshold));

	if (!compareOk || logMode == COMPARE_LOG_EVERYTHING)
	{
		// All formats except normalized unsigned fixed point ones need remapping in order to fit into unorm channels in logged images.
		if (tcu::getTextureChannelClass(reference.getFormat().type)	!= tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT ||
			tcu::getTextureChannelClass(result.getFormat().type)	!= tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)
		{
			computeScaleAndBias(reference, result, pixelScale, pixelBias);
			log << TestLog::Message << "Result and reference images are normalized with formula p * " << pixelScale << " + " << pixelBias << TestLog::EndMessage;
		}

		if (!compareOk)
			log << TestLog::Message << "Image comparison failed: max difference = " << maxDiff << ", threshold = " << threshold << TestLog::EndMessage;

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::Image("Reference",	"Reference",	reference,	pixelScale, pixelBias)
			<< TestLog::Image("ErrorMask",	"Error mask",	errorMask)
			<< TestLog::EndImageSet;
	}
	else if (logMode == COMPARE_LOG_RESULT)
	{
		if (result.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
			computePixelScaleBias(result, pixelScale, pixelBias);

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::EndImageSet;
	}

	return compareOk;
}